

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcChain.c
# Opt level: O2

Gia_Man_t * Gia_ManDupPosAndPropagateInit(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  int iLit1;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pObj;
  Gia_Man_t *pGVar4;
  int v;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  p->pObjs->Value = 0;
  Gia_ManHashAlloc(p_00);
  for (v = 1; v < p->nObjs; v = v + 1) {
    pObj = Gia_ManObj(p,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    uVar2 = (uint)*(undefined8 *)pObj;
    if ((~uVar2 & 0x1fffffff) == 0 || (int)uVar2 < 0) {
      if ((uVar2 & 0x9fffffff) == 0x9fffffff) {
        iVar1 = Gia_ObjCioId(pObj);
        if (iVar1 < p->vCis->nSize - p->nRegs) {
          uVar2 = Gia_ManAppendCi(p_00);
          goto LAB_0048cddf;
        }
        uVar2 = (uint)*(undefined8 *)pObj;
      }
      if ((uVar2 & 0x9fffffff) == 0x9fffffff) {
        pObj->Value = 0;
      }
      else if ((~uVar2 & 0x1fffffff) != 0 && (int)uVar2 < 0) {
        iVar1 = Gia_ObjCioId(pObj);
        if (iVar1 < p->vCos->nSize - p->nRegs) {
          iVar1 = Gia_ObjFanin0Copy(pObj);
          Gia_ManAppendCo(p_00,iVar1);
        }
      }
    }
    else {
      iVar1 = Gia_ObjFanin0Copy(pObj);
      iLit1 = Gia_ObjFanin1Copy(pObj);
      uVar2 = Gia_ManHashAnd(p_00,iVar1,iLit1);
LAB_0048cddf:
      pObj->Value = uVar2;
    }
  }
  Gia_ManHashStop(p_00);
  if (p->vCis->nSize - p->nRegs != p_00->vCis->nSize - p_00->nRegs) {
    __assert_fail("Gia_ManPiNum(p) == Gia_ManPiNum(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcChain.c"
                  ,0xb4,"Gia_Man_t *Gia_ManDupPosAndPropagateInit(Gia_Man_t *)");
  }
  if (p->vCos->nSize - p->nRegs == p_00->vCos->nSize - p_00->nRegs) {
    pGVar4 = Gia_ManCleanup(p_00);
    Gia_ManStop(p_00);
    return pGVar4;
  }
  __assert_fail("Gia_ManPoNum(p) == Gia_ManPoNum(pNew)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcChain.c"
                ,0xb5,"Gia_Man_t *Gia_ManDupPosAndPropagateInit(Gia_Man_t *)");
}

Assistant:

Gia_Man_t * Gia_ManDupPosAndPropagateInit( Gia_Man_t * p )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;  int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsPi(p, pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = 0;
        else if ( Gia_ObjIsPo(p, pObj) )
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    Gia_ManHashStop( pNew );
    assert( Gia_ManPiNum(p) == Gia_ManPiNum(pNew) );
    assert( Gia_ManPoNum(p) == Gia_ManPoNum(pNew) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}